

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

size_t fio_flush_all(void)

{
  ssize_t sVar1;
  fio_data_s *pfVar2;
  size_t sVar3;
  uintptr_t i;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if (fio_data == (fio_data_s *)0x0) {
    sVar3 = 0;
  }
  else {
    lVar5 = 0x6f;
    lVar6 = 0;
    sVar3 = 0;
    pfVar2 = fio_data;
    for (uVar4 = 0; uVar4 <= pfVar2->max_protocol_fd; uVar4 = uVar4 + 1) {
      if ((*(char *)((long)&(pfVar2->last_cycle).tv_sec + lVar5) != '\0') ||
         (*(long *)((long)pfVar2 + lVar5 + -0x2f) != 0)) {
        sVar1 = fio_flush((ulong)*(byte *)((long)pfVar2 + lVar5 + -2) + lVar6);
        sVar3 = sVar3 + (0 < sVar1);
        pfVar2 = fio_data;
      }
      lVar5 = lVar5 + 0xa8;
      lVar6 = lVar6 + 0x100;
    }
  }
  return sVar3;
}

Assistant:

size_t fio_flush_all(void) {
  if (!fio_data)
    return 0;
  size_t count = 0;
  for (uintptr_t i = 0; i <= fio_data->max_protocol_fd; ++i) {
    if ((fd_data(i).open || fd_data(i).packet) && fio_flush(fd2uuid(i)) > 0)
      ++count;
  }
  return count;
}